

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b)

{
  size_t sVar1;
  LogMessage *pLVar2;
  pointer pcVar3;
  size_type sVar4;
  pointer __dest;
  LogFinisher local_61;
  LogMessage local_60;
  
  pcVar3 = (result->_M_dataplus)._M_p;
  sVar4 = result->_M_string_length;
  if ((ulong)((long)a->piece_data_ - (long)pcVar3) <= sVar4) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x62f);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_61,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
    pcVar3 = (result->_M_dataplus)._M_p;
    sVar4 = result->_M_string_length;
  }
  if ((ulong)((long)b->piece_data_ - (long)pcVar3) <= sVar4) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x630);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: (uintptr_t((b).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_61,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
    sVar4 = result->_M_string_length;
  }
  std::__cxx11::string::resize((ulong)result);
  pcVar3 = (result->_M_dataplus)._M_p;
  __dest = pcVar3 + sVar4;
  memcpy(__dest,a->piece_data_,a->piece_size_);
  sVar1 = a->piece_size_;
  memcpy(__dest + sVar1,b->piece_data_,b->piece_size_);
  if (__dest + sVar1 + b->piece_size_ != pcVar3 + result->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x635);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (out) == (begin + result->size()): ");
    internal::LogFinisher::operator=(&local_61,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
  }
  return;
}

Assistant:

void StrAppend(string *result, const AlphaNum &a, const AlphaNum &b) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size());
  char *const begin = &*result->begin();
  char *out = Append2(begin + old_size, a, b);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}